

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

bool __thiscall pbrt::Vertex::IsConnectible(Vertex *this)

{
  BxDFFlags BVar1;
  bool bVar2;
  
  bVar2 = true;
  switch(this->type) {
  case Camera:
  case Medium:
    goto switchD_003f3ecf_caseD_0;
  case Light:
    bVar2 = *(int *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff) == 1;
    break;
  case Surface:
    BVar1 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
            ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                        *)&this->bsdf);
    bVar2 = (BVar1 & (Glossy|Diffuse)) == Unset;
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
             ,0x672,"Unhandled vertex type in IsConnectable()");
  }
  bVar2 = !bVar2;
switchD_003f3ecf_caseD_0:
  return bVar2;
}

Assistant:

bool IsConnectible() const {
        switch (type) {
        case VertexType::Medium:
            return true;
        case VertexType::Light:
            return ei.light.Type() != LightType::DeltaDirection;
        case VertexType::Camera:
            return true;
        case VertexType::Surface:
            return bsdf.IsNonSpecular();
        }
        LOG_FATAL("Unhandled vertex type in IsConnectable()");
    }